

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.cpp
# Opt level: O2

void __thiscall libtorrent::bitfield::resize(bitfield *this,int bits,bool val)

{
  uint *puVar1;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    uVar4 = 0;
    if (bits == 0) {
      return;
    }
  }
  else {
    uVar4 = *(uint *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    if (uVar4 == bits) {
      return;
    }
  }
  resize(this,bits);
  _Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
       (this->m_buf).super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
       super__Head_base<0UL,_unsigned_int_*,_false>;
  if (_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl == (uint *)0x0) {
    if (-1 < (int)uVar4) {
      return;
    }
    iVar5 = 0;
  }
  else {
    if (*(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl <= (int)uVar4) {
      return;
    }
    iVar5 = (*(int *)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 0x1f) / 0x20;
  }
  iVar3 = (int)(uVar4 + 0x1f) / 0x20;
  if (!val) {
    if (iVar5 - iVar3 == 0 || iVar5 < iVar3) {
      return;
    }
    memset((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                  (long)iVar3 * 4) + 1,0,(long)(iVar5 - iVar3) << 2);
    return;
  }
  if ((uVar4 & 0x1f) != 0 && uVar4 - 1 < 0xffffffc1) {
    uVar4 = 0xffffffff >> (sbyte)(uVar4 & 0x1f);
    puVar1 = (uint *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                     (long)iVar3 * 4);
    *puVar1 = *puVar1 | uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                        uVar4 << 0x18;
  }
  if (iVar5 - iVar3 != 0 && iVar3 <= iVar5) {
    memset((int *)((long)_Var2.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                  (long)iVar3 * 4) + 1,0xff,(long)(iVar5 - iVar3) << 2);
  }
  clear_trailing_bits(this);
  return;
}

Assistant:

void bitfield::resize(int const bits, bool const val)
	{
		if (bits == size()) return;

		int const s = size();
		int const b = size() & 31;
		resize(bits);
		if (s >= size()) return;
		int const old_size_words = (s + 31) / 32;
		int const new_size_words = num_words();
		if (val)
		{
			if (old_size_words && b) buf()[old_size_words - 1] |= aux::host_to_network(0xffffffff >> b);
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0xff
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
			clear_trailing_bits();
		}
		else
		{
			if (old_size_words < new_size_words)
				std::memset(buf() + old_size_words, 0x00
					, static_cast<std::size_t>(new_size_words - old_size_words) * 4);
		}
		TORRENT_ASSERT(size() == bits);
	}